

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodeSetPtr xmlXPathPopNodeSet(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlXPathObjectPtr *ppxVar2;
  xmlNodeSetPtr pxVar3;
  uint uVar4;
  xmlXPathObjectPtr pxVar5;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (ctxt->value == (xmlXPathObjectPtr)0x0) {
      xmlXPathErr(ctxt,10);
      ctxt->error = 10;
    }
    else {
      if ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE) {
        iVar1 = ctxt->valueNr;
        if ((long)iVar1 < 1) {
          pxVar5 = (xmlXPathObjectPtr)0x0;
        }
        else {
          uVar4 = iVar1 - 1;
          ctxt->valueNr = uVar4;
          ppxVar2 = ctxt->valueTab;
          if (iVar1 == 1) {
            pxVar5 = (xmlXPathObjectPtr)0x0;
          }
          else {
            pxVar5 = ppxVar2[(long)iVar1 + -2];
          }
          ctxt->value = pxVar5;
          pxVar5 = ppxVar2[uVar4];
          ppxVar2[uVar4] = (xmlXPathObjectPtr)0x0;
        }
        pxVar3 = pxVar5->nodesetval;
        pxVar5->nodesetval = (xmlNodeSetPtr)0x0;
        xmlXPathReleaseObject(ctxt->context,pxVar5);
        return pxVar3;
      }
      xmlXPathErr(ctxt,0xb);
      ctxt->error = 0xb;
    }
  }
  return (xmlNodeSetPtr)0x0;
}

Assistant:

xmlNodeSetPtr
xmlXPathPopNodeSet (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    xmlNodeSetPtr ret;

    if (ctxt == NULL) return(NULL);
    if (ctxt->value == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(NULL);
    }
    if (!xmlXPathStackIsNodeSet(ctxt)) {
	xmlXPathSetTypeError(ctxt);
	return(NULL);
    }
    obj = valuePop(ctxt);
    ret = obj->nodesetval;
    obj->nodesetval = NULL;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}